

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O0

size_t wasm::anon_unknown_0::shapeHash(Type a)

{
  bool bVar1;
  Tuple *a_00;
  size_t otherDigest;
  Exactness local_64;
  Nullability local_60 [2];
  HeapType local_58;
  TypeID local_50;
  int local_44;
  HeapType local_40;
  int local_38 [2];
  size_t local_30;
  size_t digest;
  size_t local_20;
  size_t digest_1;
  Type a_local;
  
  digest_1 = a.id;
  bVar1 = wasm::Type::isTuple((Type *)&digest_1);
  if (bVar1) {
    digest._4_4_ = 0;
    local_20 = hash<int>((int *)((long)&digest + 4));
    a_00 = wasm::Type::getTuple((Type *)&digest_1);
    otherDigest = shapeHash(a_00);
    hash_combine(&local_20,otherDigest);
    a_local.id = local_20;
  }
  else {
    local_38[1] = 1;
    local_30 = hash<int>(local_38 + 1);
    bVar1 = wasm::Type::isRef((Type *)&digest_1);
    if (bVar1) {
      local_40 = wasm::Type::getHeapType((Type *)&digest_1);
      bVar1 = HeapType::isBasic(&local_40);
      if (bVar1) {
        local_44 = 3;
        rehash<int>(&local_30,&local_44);
        local_58 = wasm::Type::getHeapType((Type *)&digest_1);
        local_50 = HeapType::getID(&local_58);
        rehash<unsigned_long>(&local_30,&local_50);
        a_local.id = local_30;
      }
      else {
        local_60[1] = 4;
        rehash<int>(&local_30,(int *)(local_60 + 1));
        local_60[0] = wasm::Type::getNullability((Type *)&digest_1);
        rehash<int>(&local_30,(int *)local_60);
        local_64 = wasm::Type::getExactness((Type *)&digest_1);
        rehash<int>(&local_30,(int *)&local_64);
        a_local.id = local_30;
      }
    }
    else {
      local_38[0] = 2;
      rehash<int>(&local_30,local_38);
      a_local.id = local_30;
    }
  }
  return a_local.id;
}

Assistant:

size_t shapeHash(Type a) {
  if (a.isTuple()) {
    auto digest = hash(0);
    hash_combine(digest, shapeHash(a.getTuple()));
    return digest;
  }
  auto digest = hash(1);
  if (!a.isRef()) {
    rehash(digest, 2);
    return digest;
  }
  if (a.getHeapType().isBasic()) {
    rehash(digest, 3);
    rehash(digest, a.getHeapType().getID());
    return digest;
  }
  rehash(digest, 4);
  rehash(digest, (int)a.getNullability());
  rehash(digest, (int)a.getExactness());
  return digest;
}